

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O0

void __thiscall GrcMasterTable::SetupGlyphAttrs(GrcMasterTable *this)

{
  GrcSymbolTableEntry *this_00;
  bool bVar1;
  pointer ppVar2;
  GdlGlyphClassDefn *pglfc;
  GrcMasterValueList *pmvl;
  Symbol psymClassName;
  iterator itvlistmap;
  GdlGlyphClassDefn *in_stack_00000328;
  GrcMasterValueList *in_stack_00000330;
  GrcMasterTable *in_stack_ffffffffffffffb8;
  GdlDefn *in_stack_ffffffffffffffc0;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node = (_Base_ptr)EntriesBegin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_18._M_node = (_Base_ptr)EntriesEnd(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::
             operator->((_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>
                         *)in_stack_ffffffffffffffc0);
    this_00 = ppVar2->first;
    std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_> *)
               in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = GrcSymbolTableEntry::Data(this_00);
    if (in_stack_ffffffffffffffc0 == (GdlDefn *)0x0) {
      in_stack_ffffffffffffffb8 = (GrcMasterTable *)0x0;
    }
    else {
      in_stack_ffffffffffffffb8 =
           (GrcMasterTable *)
           __dynamic_cast(in_stack_ffffffffffffffc0,&GdlDefn::typeinfo,&GdlGlyphClassDefn::typeinfo,
                          0);
    }
    GrcMasterValueList::SetupGlyphAttrs(in_stack_00000330,in_stack_00000328);
    std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_> *)
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void GrcMasterTable::SetupGlyphAttrs()
{
	for (ValueListMap::iterator itvlistmap = EntriesBegin();
		itvlistmap != EntriesEnd();
		++itvlistmap)
	{
		Symbol psymClassName = itvlistmap->first;   // GetKey();
		GrcMasterValueList * pmvl = itvlistmap->second;  // GetValue();

		Assert(psymClassName->FitsSymbolType(ksymtClass));

		GdlGlyphClassDefn * pglfc = dynamic_cast<GdlGlyphClassDefn*>(psymClassName->Data());
		Assert(pglfc);

		pmvl->SetupGlyphAttrs(pglfc);
	}
}